

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *other)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  Index size;
  undefined8 *puVar7;
  Index index;
  ulong uVar8;
  long lVar9;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar4 = *(long *)(other + 0x20);
  lVar9 = *(long *)(other + 0x28);
  if ((lVar9 != 0 && lVar4 != 0) &&
     (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar6 / SEXT816(lVar9),0) < lVar4)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,lVar9,SUB168(auVar6 % SEXT816(lVar9),0));
    *puVar7 = std::random_device::_M_fini;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (lVar9 != 1 && lVar4 != 1) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x16e,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>>]"
                 );
  }
  lVar9 = lVar9 * lVar4;
  if (-1 < lVar9) {
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar9,lVar9,1);
    dVar2 = *(double *)(other + 0x18);
    dVar3 = *(double *)(other + 0x30);
    uVar8 = *(ulong *)(other + 0x20);
    lVar4 = *(long *)(other + 0x28);
    if (lVar4 != 1 || *(ulong *)(this + 8) != uVar8) {
      if (((long)uVar8 < 0) || (lVar4 != 1)) goto LAB_0013adcc;
      DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar8,uVar8,1);
    }
    uVar5 = *(ulong *)(this + 8);
    if ((uVar5 == uVar8) && (lVar4 == 1)) {
      lVar4 = *(long *)this;
      uVar8 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
      dVar2 = dVar2 * dVar3;
      if (1 < (long)uVar5) {
        lVar9 = 0;
        do {
          pdVar1 = (double *)(lVar4 + lVar9 * 8);
          *pdVar1 = dVar2;
          pdVar1[1] = dVar2;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar5) {
        do {
          *(double *)(lVar4 + uVar8 * 8) = dVar2;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      return;
    }
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>>, T1 = double, T2 = double]"
                 );
  }
LAB_0013adcc:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }